

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardSubsumptionDemodulation.cpp
# Opt level: O0

void __thiscall
Inferences::ForwardSubsumptionDemodulation::attach
          (ForwardSubsumptionDemodulation *this,SaturationAlgorithm *salg)

{
  SaturationAlgorithm *in_RSI;
  IndexManager *in_RDI;
  IndexType type;
  
  InferenceEngine::attach((InferenceEngine *)in_RDI,in_RSI);
  type = (IndexType)((ulong)&(in_RDI->_store)._afterLast >> 0x20);
  Saturation::SaturationAlgorithm::getIndexManager((SaturationAlgorithm *)0x7b89da);
  Indexing::RequestedIndex<Indexing::LiteralIndex<Indexing::LiteralClause>_>::request
            ((RequestedIndex<Indexing::LiteralIndex<Indexing::LiteralClause>_> *)in_RSI,in_RDI,type)
  ;
  *(undefined1 *)&in_RDI[1]._store._timestamp = 0;
  *(undefined1 *)((long)&in_RDI[1]._store._timestamp + 1) = 0;
  if ((in_RDI[1]._store._timestamp & 0x10000) != 0) {
    Saturation::SaturationAlgorithm::getIndexManager((SaturationAlgorithm *)0x7b8a16);
    Indexing::RequestedIndex<Indexing::LiteralIndex<Indexing::LiteralClause>_>::request
              ((RequestedIndex<Indexing::LiteralIndex<Indexing::LiteralClause>_> *)in_RSI,in_RDI,
               type);
  }
  return;
}

Assistant:

void ForwardSubsumptionDemodulation::attach(SaturationAlgorithm* salg)
{
  ForwardSimplificationEngine::attach(salg);

  _index.request(salg->getIndexManager(), FSD_SUBST_TREE);

  _preorderedOnly = false;
  _allowIncompleteness = false;

  if (_doSubsumption) {
    _unitIndex.request(salg->getIndexManager(), FW_SUBSUMPTION_UNIT_CLAUSE_SUBST_TREE);
  }
}